

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
          (QGraphicsSceneDragDropEvent *this,Type type)

{
  QGraphicsSceneEventPrivate *dd;
  
  dd = (QGraphicsSceneEventPrivate *)operator_new(0x70);
  dd->widget = (QWidget *)0x0;
  dd->q_ptr = (QGraphicsSceneEvent *)0x0;
  dd->timestamp = 0;
  dd->_vptr_QGraphicsSceneEventPrivate = (_func_int **)&PTR__QGraphicsSceneEventPrivate_007eded0;
  dd[1]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  dd[1].widget = (QWidget *)0x0;
  dd[1].q_ptr = (QGraphicsSceneEvent *)0x0;
  dd[1].timestamp = 0;
  dd[2]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  dd[2].widget = (QWidget *)0x0;
  *(undefined4 *)&dd[2].q_ptr = 0;
  dd[3]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  dd[3].widget = (QWidget *)0x0;
  QGraphicsSceneEvent::QGraphicsSceneEvent(&this->super_QGraphicsSceneEvent,dd,type);
  *(undefined ***)&this->super_QGraphicsSceneEvent = &PTR__QGraphicsSceneHelpEvent_007edc20;
  return;
}

Assistant:

QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneDragDropEventPrivate, type)
{
}